

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

GLFWbool resizeWindow(_GLFWwindow *window,int width,int height)

{
  wp_viewport *wp_viewport;
  int iVar1;
  int iVar2;
  GLFWbool GVar3;
  
  iVar1 = _glfw_max(width,1);
  iVar2 = _glfw_max(height,1);
  if ((iVar1 != (window->wl).width) || (GVar3 = 0, iVar2 != (window->wl).height)) {
    (window->wl).width = iVar1;
    (window->wl).height = iVar2;
    resizeFramebuffer(window);
    wp_viewport = (window->wl).scalingViewport;
    if (wp_viewport != (wp_viewport *)0x0) {
      wp_viewport_set_destination(wp_viewport,(window->wl).width,(window->wl).height);
    }
    GVar3 = 1;
    if ((window->wl).fallback.decorations != 0) {
      wp_viewport_set_destination((window->wl).fallback.top.viewport,(window->wl).width,0x18);
      wl_surface_commit((window->wl).fallback.top.surface);
      wp_viewport_set_destination((window->wl).fallback.left.viewport,4,(window->wl).height + 0x18);
      wl_surface_commit((window->wl).fallback.left.surface);
      wl_subsurface_set_position((window->wl).fallback.right.subsurface,(window->wl).width,-0x18);
      wp_viewport_set_destination((window->wl).fallback.right.viewport,4,(window->wl).height + 0x18)
      ;
      wl_surface_commit((window->wl).fallback.right.surface);
      wl_subsurface_set_position((window->wl).fallback.bottom.subsurface,-4,(window->wl).height);
      wp_viewport_set_destination((window->wl).fallback.bottom.viewport,(window->wl).width + 8,4);
      wl_surface_commit((window->wl).fallback.bottom.surface);
    }
  }
  return GVar3;
}

Assistant:

static GLFWbool resizeWindow(_GLFWwindow* window, int width, int height)
{
    width = _glfw_max(width, 1);
    height = _glfw_max(height, 1);

    if (width == window->wl.width && height == window->wl.height)
        return GLFW_FALSE;

    window->wl.width = width;
    window->wl.height = height;

    resizeFramebuffer(window);

    if (window->wl.scalingViewport)
    {
        wp_viewport_set_destination(window->wl.scalingViewport,
                                    window->wl.width,
                                    window->wl.height);
    }

    if (window->wl.fallback.decorations)
    {
        wp_viewport_set_destination(window->wl.fallback.top.viewport,
                                    window->wl.width,
                                    GLFW_CAPTION_HEIGHT);
        wl_surface_commit(window->wl.fallback.top.surface);

        wp_viewport_set_destination(window->wl.fallback.left.viewport,
                                    GLFW_BORDER_SIZE,
                                    window->wl.height + GLFW_CAPTION_HEIGHT);
        wl_surface_commit(window->wl.fallback.left.surface);

        wl_subsurface_set_position(window->wl.fallback.right.subsurface,
                                window->wl.width, -GLFW_CAPTION_HEIGHT);
        wp_viewport_set_destination(window->wl.fallback.right.viewport,
                                    GLFW_BORDER_SIZE,
                                    window->wl.height + GLFW_CAPTION_HEIGHT);
        wl_surface_commit(window->wl.fallback.right.surface);

        wl_subsurface_set_position(window->wl.fallback.bottom.subsurface,
                                -GLFW_BORDER_SIZE, window->wl.height);
        wp_viewport_set_destination(window->wl.fallback.bottom.viewport,
                                    window->wl.width + GLFW_BORDER_SIZE * 2,
                                    GLFW_BORDER_SIZE);
        wl_surface_commit(window->wl.fallback.bottom.surface);
    }

    return GLFW_TRUE;
}